

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

int read_decorr_terms(WavpackStream *wps,WavpackMetadata *wpmd)

{
  int iVar1;
  void *pvVar2;
  ushort *puVar3;
  long lVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  
  iVar1 = wpmd->byte_length;
  if ((long)iVar1 < 0x11) {
    pvVar2 = wpmd->data;
    wps->num_terms = iVar1;
    puVar3 = (ushort *)((long)(wps->w).c + (long)iVar1 * 0x48 + -6);
    lVar4 = 0;
    do {
      if (iVar1 == (int)lVar4) {
        return 1;
      }
      uVar6 = *(byte *)((long)pvVar2 + lVar4) & 0x1f;
      uVar7 = uVar6 - 5;
      puVar3[-1] = uVar7;
      *puVar3 = (ushort)(*(byte *)((long)pvVar2 + lVar4) >> 5);
      bVar5 = (byte)uVar6;
      if (bVar5 < 2) {
        return 0;
      }
      if (uVar7 == 0) {
        return 0;
      }
      if (0x17 < bVar5) {
        return 0;
      }
      lVar4 = lVar4 + 1;
      puVar3 = puVar3 + -0x24;
    } while (7 < (byte)(bVar5 - 0xe));
  }
  return 0;
}

Assistant:

int read_decorr_terms (WavpackStream *wps, WavpackMetadata *wpmd)
{
    int termcnt = wpmd->byte_length;
    uchar *byteptr = wpmd->data;
    struct decorr_pass *dpp;

    if (termcnt > MAX_NTERMS)
        return FALSE;

    wps->num_terms = termcnt;

    for (dpp = wps->decorr_passes + termcnt - 1; termcnt--; dpp--) {
        dpp->term = (int)(*byteptr & 0x1f) - 5;
        dpp->delta = (*byteptr++ >> 5) & 0x7;

        if (!dpp->term || dpp->term < -3 || (dpp->term > MAX_TERM && dpp->term < 17) || dpp->term > 18)
            return FALSE;
    }

    return TRUE;
}